

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfreelist_p.h
# Opt level: O2

int __thiscall
QFreeList<void,_QtTimerIdFreeListConstants>::next(QFreeList<void,_QtTimerIdFreeListConstants> *this)

{
  uint uVar1;
  int iVar2;
  ElementType *pEVar3;
  long in_FS_OFFSET;
  bool bVar4;
  int at;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    uVar1 = (this->_next).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i;
    local_3c = uVar1 & 0xffffff;
    iVar2 = blockfor((int *)&local_3c);
    pEVar3 = this->_v[iVar2].super_QBasicAtomicPointer<QFreeListElement<void>_>._q_value._M_b._M_p;
    if (pEVar3 == (ElementType *)0x0) {
      pEVar3 = allocate((uVar1 & 0xffffff) - local_3c,QtTimerIdFreeListConstants::Sizes[iVar2]);
      LOCK();
      bVar4 = this->_v[iVar2].super_QBasicAtomicPointer<QFreeListElement<void>_>._q_value._M_b._M_p
              == (__pointer_type)0x0;
      if (bVar4) {
        this->_v[iVar2].super_QBasicAtomicPointer<QFreeListElement<void>_>._q_value._M_b._M_p =
             pEVar3;
      }
      UNLOCK();
      if (!bVar4) {
        if (pEVar3 != (ElementType *)0x0) {
          operator_delete__(pEVar3);
        }
        pEVar3 = this->_v[iVar2].super_QBasicAtomicPointer<QFreeListElement<void>_>._q_value._M_b.
                 _M_p;
      }
    }
    LOCK();
    bVar4 = uVar1 == (this->_next).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int>._M_i;
    if (bVar4) {
      (this->_next).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           uVar1 & 0xff000000 |
           pEVar3[(int)local_3c].next.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i;
    }
    UNLOCK();
  } while (!bVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar1;
}

Assistant:

inline int QFreeList<T, ConstantsType>::next()
{
    int id, newid, at;
    ElementType *v;
    do {
        id = _next.loadAcquire();

        at = id & ConstantsType::IndexMask;
        const int block = blockfor(at);
        v = _v[block].loadAcquire();

        if (!v) {
            v = allocate((id & ConstantsType::IndexMask) - at, ConstantsType::Sizes[block]);
            if (!_v[block].testAndSetRelease(nullptr, v)) {
                // race with another thread lost
                delete[] v;
                v = _v[block].loadAcquire();
                Q_ASSERT(v != nullptr);
            }
        }

        newid = v[at].next.loadRelaxed() | (id & ~ConstantsType::IndexMask);
    } while (!_next.testAndSetRelease(id, newid));
    // qDebug("QFreeList::next(): returning %d (_next now %d, serial %d)",
    //        id & ConstantsType::IndexMask,
    //        newid & ConstantsType::IndexMask,
    //        (newid & ~ConstantsType::IndexMask) >> 24);
    return id;
}